

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

int64_t __thiscall adios2::profiling::Timer::GetElapsedTime(Timer *this)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  size_type *psVar5;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (this->m_InitialTimeSet == false) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Toolkit","");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"profiling::iochrono::Timer","");
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"GetElapsedTime","");
    std::operator+(&local_48,"Resume() in process ",&this->m_Process);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
    psVar5 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_c8.field_2._M_allocated_capacity = *psVar5;
      local_c8.field_2._8_8_ = plVar1[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar5;
      local_c8._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_c8._M_string_length = plVar1[1];
    *plVar1 = (long)psVar5;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    helper::Throw<std::invalid_argument>(&local_68,&local_88,&local_a8,&local_c8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  switch(this->m_TimeUnit) {
  case Microseconds:
    uVar3 = (this->m_ElapsedTime).__d.__r - (this->m_InitialTime).__d.__r;
    uVar4 = uVar3 >> 0x3f;
    lVar2 = (long)uVar3 / 1000 + ((long)uVar3 >> 0x3f);
    break;
  case Milliseconds:
    uVar3 = (this->m_ElapsedTime).__d.__r - (this->m_InitialTime).__d.__r;
    uVar4 = uVar3 >> 0x3f;
    lVar2 = (long)uVar3 / 1000000 + ((long)uVar3 >> 0x3f);
    break;
  case Seconds:
    uVar3 = (this->m_ElapsedTime).__d.__r - (this->m_InitialTime).__d.__r;
    uVar4 = uVar3 >> 0x3f;
    lVar2 = (long)uVar3 / 1000000000 + ((long)uVar3 >> 0x3f);
    break;
  case Minutes:
    uVar3 = (this->m_ElapsedTime).__d.__r - (this->m_InitialTime).__d.__r;
    uVar4 = uVar3 >> 0x3f;
    lVar2 = (long)uVar3 / 60000000000 + ((long)uVar3 >> 0x3f);
    break;
  case Hours:
    uVar3 = (this->m_ElapsedTime).__d.__r - (this->m_InitialTime).__d.__r;
    uVar4 = uVar3 >> 0x3f;
    lVar2 = (long)uVar3 / 3600000000000 + ((long)uVar3 >> 0x3f);
    break;
  default:
    return -1;
  }
  return lVar2 + uVar4;
}

Assistant:

int64_t Timer::GetElapsedTime()
{
    if (!m_InitialTimeSet)
    {
        helper::Throw<std::invalid_argument>("Toolkit", "profiling::iochrono::Timer",
                                             "GetElapsedTime",
                                             "Resume() in process " + m_Process + " not called");
    }

    int64_t time = -1;

    switch (m_TimeUnit)
    {

    case TimeUnit::Microseconds:
        time = std::chrono::duration_cast<std::chrono::microseconds>(m_ElapsedTime - m_InitialTime)
                   .count();
        break;

    case TimeUnit::Milliseconds:
        time = std::chrono::duration_cast<std::chrono::milliseconds>(m_ElapsedTime - m_InitialTime)
                   .count();
        break;

    case TimeUnit::Seconds:
        time =
            std::chrono::duration_cast<std::chrono::seconds>(m_ElapsedTime - m_InitialTime).count();
        break;

    case TimeUnit::Minutes:
        time =
            std::chrono::duration_cast<std::chrono::minutes>(m_ElapsedTime - m_InitialTime).count();
        break;

    case TimeUnit::Hours:
        time =
            std::chrono::duration_cast<std::chrono::hours>(m_ElapsedTime - m_InitialTime).count();
        break;
    }

    return time;
}